

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.hpp
# Opt level: O0

void boost::python::detail::define_class_init_helper<0>::
     apply<boost::python::class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>,boost::mpl::size<boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>>>
               (undefined8 param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,
               undefined8 param_5)

{
  def_init_aux<boost::python::class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>,boost::mpl::size<boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>>>
            (param_1,param_3,param_2,param_4,param_5);
  return;
}

Assistant:

static void apply(
          ClassT& cl
        , CallPoliciesT const& policies
        , Signature const& args
        , NArgs
        , char const* doc
        , detail::keyword_range const& keywords)
      {
          detail::def_init_aux(cl, args, NArgs(), policies, doc, keywords);
      }